

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O2

char * helics::actionMessageType(action_t action)

{
  const_iterator pvVar1;
  char *pcVar2;
  action_t local_4;
  
  pvVar1 = frozen::
           unordered_map<helics::action_message_def::action_t,_std::basic_string_view<char,_std::char_traits<char>_>,_96UL,_frozen::elsa<helics::action_message_def::action_t>,_std::equal_to<helics::action_message_def::action_t>_>
           ::find<helics::action_message_def::action_t>
                     ((unordered_map<helics::action_message_def::action_t,_std::basic_string_view<char,_std::char_traits<char>_>,_96UL,_frozen::elsa<helics::action_message_def::action_t>,_std::equal_to<helics::action_message_def::action_t>_>
                       *)actionStrings,&local_4);
  if (pvVar1 == (const_iterator)(actionStrings + 0x908)) {
    pcVar2 = "unknown";
  }
  else {
    pcVar2 = (pvVar1->second)._M_str;
  }
  return pcVar2;
}

Assistant:

const char* actionMessageType(action_message_def::action_t action)
{
    const auto* res = actionStrings.find(action);
    return (res != actionStrings.end()) ? res->second.data() : static_cast<const char*>(unknownStr);
}